

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::GeometryShaderTestInstance::executeTest
          (TestStatus *__return_storage_ptr__,GeometryShaderTestInstance *this)

{
  VkAllocationCallbacks **pCreateInfo;
  allocator<vk::VkClearValue> *this_00;
  VkRenderPass _renderPass;
  VkCommandBuffer pVVar1;
  VkCommandBuffer_s *pVVar2;
  RefData<vk::Handle<(vk::HandleType)11>_> data;
  RefData<vk::VkCommandBuffer_s_*> data_00;
  VkRect2D _renderArea;
  deUint32 _queueFamilyIndex;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Buffer *this_01;
  Handle<(vk::HandleType)24> *pHVar3;
  VkCommandBuffer_s **ppVVar4;
  reference ptr;
  size_type sVar5;
  Handle<(vk::HandleType)17> *pHVar6;
  Handle<(vk::HandleType)23> *pHVar7;
  Image *pIVar8;
  VkImage VVar9;
  Handle<(vk::HandleType)11> *pHVar10;
  Handle<(vk::HandleType)18> *pHVar11;
  undefined1 local_1f0 [8];
  RenderPassBeginInfo renderPassBegin;
  undefined1 local_190 [8];
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> renderPassClearValues;
  VkRect2D renderArea;
  Move<vk::VkCommandBuffer_s_*> local_160;
  RefData<vk::VkCommandBuffer_s_*> local_140;
  undefined1 local_120 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  VkBuffer vertexBuffer;
  SharedPtr<vkt::Draw::Buffer> vertexBufferSp;
  VkDeviceSize vertexBufferOffset;
  Move<vk::Handle<(vk::HandleType)11>_> local_d0;
  RefData<vk::Handle<(vk::HandleType)11>_> local_b0;
  undefined1 local_90 [8];
  Unique<vk::Handle<(vk::HandleType)11>_> queryPool;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  CmdPoolCreateInfo cmdPoolCreateInfo;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  GeometryShaderTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface
                    ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                     super_TestInstance.m_context);
  device_00 = Context::getDevice((this->super_GraphicBasicTestInstance).
                                 super_StatisticQueryTestInstance.super_TestInstance.m_context);
  queue_00 = Context::getUniversalQueue
                       ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                        super_TestInstance.m_context);
  _queueFamilyIndex =
       Context::getUniversalQueueFamilyIndex
                 ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                  super_TestInstance.m_context);
  pCreateInfo = &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  Draw::CmdPoolCreateInfo::CmdPoolCreateInfo((CmdPoolCreateInfo *)pCreateInfo,_queueFamilyIndex,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator,
             vk_00,device_00,(VkCommandPoolCreateInfo *)pCreateInfo,(VkAllocationCallbacks *)0x0);
  makeQueryPool(&local_d0,vk_00,device_00,
                ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->queryStatisticFlags);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_b0,(Move *)&local_d0);
  data.deleter.m_deviceIface._0_4_ = (int)local_b0.deleter.m_deviceIface;
  data.object.m_internal = local_b0.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_b0.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device = local_b0.deleter.m_device;
  data.deleter.m_allocator = local_b0.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_90,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)11>_>::~Move(&local_d0);
  vertexBufferSp.m_state = (SharedPtrStateBase *)0x0;
  GraphicBasicTestInstance::creatAndFillVertexBuffer((GraphicBasicTestInstance *)&vertexBuffer);
  this_01 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      ((SharedPtr<vkt::Draw::Buffer> *)&vertexBuffer);
  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       (deUint64)Draw::Buffer::object(this_01);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)
                      &queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.
                       m_allocator);
  ::vk::allocateCommandBuffer
            (&local_160,vk_00,device_00,(VkCommandPool)pHVar3->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_140,(Move *)&local_160);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_140.deleter.m_deviceIface;
  data_00.object = local_140.object;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_140.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_140.deleter.m_device;
  data_00.deleter.m_pool.m_internal = local_140.deleter.m_pool.m_internal;
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_120,data_00);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_160);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  beginCommandBuffer(vk_00,*ppVVar4);
  renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (allocator<vk::VkClearValue> *)
            ((long)&renderPassBegin.m_clearValues.
                    super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<vk::VkClearValue>::allocator(this_00);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_190,2,this_00);
  std::allocator<vk::VkClearValue>::~allocator
            ((allocator<vk::VkClearValue> *)
             ((long)&renderPassBegin.m_clearValues.
                     super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl
                     .super__Vector_impl_data._M_end_of_storage + 7));
  ptr = std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::operator[]
                  ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_190,0);
  sVar5 = std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::size
                    ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_190);
  ::deMemset(ptr,0,(long)(int)sVar5 << 4);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->super_GraphicBasicTestInstance).m_renderPass.
                       super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  _renderPass.m_internal = pHVar6->m_internal;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                     (&(this->super_GraphicBasicTestInstance).m_framebuffer.
                       super_RefBase<vk::Handle<(vk::HandleType)23>_>);
  _renderArea.extent.width = 0x40;
  _renderArea.extent.height = 0x40;
  _renderArea.offset =
       (VkOffset2D)
       renderPassClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  Draw::RenderPassBeginInfo::RenderPassBeginInfo
            ((RenderPassBeginInfo *)local_1f0,_renderPass,(VkFramebuffer)pHVar7->m_internal,
             _renderArea,(vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_190);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  pVVar1 = *ppVVar4;
  pIVar8 = de::SharedPtr<vkt::Draw::Image>::operator->
                     (&(this->super_GraphicBasicTestInstance).m_colorAttachmentImage);
  VVar9 = Draw::Image::object(pIVar8);
  Draw::transition2DImage
            (vk_00,pVVar1,VVar9,1,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL
             ,0,0x100);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  pVVar1 = *ppVVar4;
  pIVar8 = de::SharedPtr<vkt::Draw::Image>::operator->
                     (&(this->super_GraphicBasicTestInstance).m_depthImage);
  VVar9 = Draw::Image::object(pIVar8);
  Draw::transition2DImage
            (vk_00,pVVar1,VVar9,2,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0,0x400);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  pVVar2 = *ppVVar4;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x70])(vk_00,pVVar2,pHVar10->m_internal,0,1);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  (*vk_00->_vptr_DeviceInterface[0x74])(vk_00,*ppVVar4,local_1f0,0);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  pVVar2 = *ppVVar4;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x6e])(vk_00,pVVar2,pHVar10->m_internal,0);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  (*vk_00->_vptr_DeviceInterface[0x58])
            (vk_00,*ppVVar4,0,1,
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
             &vertexBufferSp.m_state);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  pVVar2 = *ppVVar4;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->super_GraphicBasicTestInstance).m_pipeline.
                        super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,0,pHVar11->m_internal);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  (*(this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.super_TestInstance.
    _vptr_TestInstance[7])(this,*ppVVar4);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  pVVar2 = *ppVVar4;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_90);
  (*vk_00->_vptr_DeviceInterface[0x6f])(vk_00,pVVar2,pHVar10->m_internal,0);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  (*vk_00->_vptr_DeviceInterface[0x76])(vk_00,*ppVVar4);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  pVVar1 = *ppVVar4;
  pIVar8 = de::SharedPtr<vkt::Draw::Image>::operator->
                     (&(this->super_GraphicBasicTestInstance).m_colorAttachmentImage);
  VVar9 = Draw::Image::object(pIVar8);
  Draw::transition2DImage
            (vk_00,pVVar1,VVar9,1,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_GENERAL,0
             ,0x100);
  Draw::RenderPassBeginInfo::~RenderPassBeginInfo((RenderPassBeginInfo *)local_1f0);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)local_190);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  (*vk_00->_vptr_DeviceInterface[0x4a])(vk_00,*ppVVar4);
  ppVVar4 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_120);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar4);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)11>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)11>_> *)local_90);
  (*(this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.super_TestInstance.
    _vptr_TestInstance[6])(__return_storage_ptr__,this,pHVar10->m_internal);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_120);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)&vertexBuffer);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)11>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)11>_> *)local_90);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &queryPool.super_RefBase<vk::Handle<(vk::HandleType)11>_>.m_data.deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GeometryShaderTestInstance::executeTest (void)
{
	const DeviceInterface&					vk						= m_context.getDeviceInterface();
	const VkDevice							device					= m_context.getDevice();
	const VkQueue							queue					= m_context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();

	const CmdPoolCreateInfo					cmdPoolCreateInfo		(queueFamilyIndex);
	const Move<VkCommandPool>				cmdPool					= createCommandPool(vk, device, &cmdPoolCreateInfo);
	const Unique<VkQueryPool>				queryPool				(makeQueryPool(vk, device, m_parametersGraphic.queryStatisticFlags));

	const VkDeviceSize						vertexBufferOffset		= 0u;
	const de::SharedPtr<Buffer>				vertexBufferSp			= creatAndFillVertexBuffer();
	const VkBuffer							vertexBuffer			= vertexBufferSp->object();

	const Unique<VkCommandBuffer>			cmdBuffer				(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	beginCommandBuffer(vk, *cmdBuffer);
	{
		const VkRect2D				renderArea				= { { 0, 0 }, { WIDTH, HEIGHT } };
		std::vector<VkClearValue>	renderPassClearValues	(2);
		deMemset(&renderPassClearValues[0], 0, static_cast<int>(renderPassClearValues.size()) * sizeof(VkClearValue));
		const RenderPassBeginInfo	renderPassBegin			(*m_renderPass, *m_framebuffer, renderArea, renderPassClearValues);

		transition2DImage(vk, *cmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
		transition2DImage(vk, *cmdBuffer, m_depthImage->object(), VK_IMAGE_ASPECT_DEPTH_BIT, VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL, 0, VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT);

		vk.cmdResetQueryPool(*cmdBuffer, *queryPool, 0u, 1u);

		vk.cmdBeginRenderPass(*cmdBuffer, &renderPassBegin, VK_SUBPASS_CONTENTS_INLINE);

		vk.cmdBeginQuery(*cmdBuffer, *queryPool, 0u, (VkQueryControlFlags)0u);
		vk.cmdBindVertexBuffers(*cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);
		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

		draw(*cmdBuffer);

		vk.cmdEndQuery(*cmdBuffer, *queryPool, 0u);

		vk.cmdEndRenderPass(*cmdBuffer);

		transition2DImage(vk, *cmdBuffer, m_colorAttachmentImage->object(), VK_IMAGE_ASPECT_COLOR_BIT, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_GENERAL, 0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
	}
	vk.endCommandBuffer(*cmdBuffer);

	// Wait for completion
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	return checkResult(*queryPool);
}